

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O3

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *piVar3;
  long lVar4;
  param_type *ppVar5;
  byte bVar6;
  delim_c local_cc;
  delim_c local_cb;
  delim_c local_ca;
  delim_c local_c9;
  unkbyte10 local_c8;
  unkbyte10 local_b8;
  unkbyte10 local_a8;
  unkbyte10 local_98;
  param_type local_88;
  
  bVar6 = 0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_88.mu_._0_10_ = CONCAT91(local_88.mu_._1_9_,0x28);
  pbVar2 = utility::operator>>(in,(delim_c *)&local_88);
  piVar3 = std::istream::_M_extract<long_double>((longdouble *)pbVar2);
  local_c9.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_c9);
  piVar3 = std::istream::_M_extract<long_double>((longdouble *)pbVar2);
  local_ca.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_ca);
  piVar3 = std::istream::_M_extract<long_double>((longdouble *)pbVar2);
  local_cb.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_cb);
  piVar3 = std::istream::_M_extract<long_double>((longdouble *)pbVar2);
  local_cc.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_cc);
  lVar4 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar4 + 0x20] & 5) == 0) {
    local_88.mu_._0_10_ = local_98;
    local_88.sigma_._0_10_ = local_a8;
    local_88.a_._0_10_ = local_b8;
    local_88.b_._0_10_ = local_c8;
    local_88.Phi_a._0_10_ = (longdouble)0;
    local_88.Phi_b._0_10_ = (longdouble)1;
    truncated_normal_dist<long_double>::param_type::update_Phi(&local_88);
    ppVar5 = &local_88;
    for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined8 *)&P->mu_ = *(undefined8 *)&ppVar5->mu_;
      ppVar5 = (param_type *)((long)ppVar5 + (ulong)bVar6 * -0x10 + 8);
      P = (param_type *)((long)P + (ulong)bVar6 * -0x10 + 8);
    }
    lVar4 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar4 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t mu, sigma, a, b;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> mu >> utility::delim(' ') >> sigma >>
            utility::delim(' ') >> a >> utility::delim(' ') >> b >> utility::delim(')');
        if (in)
          P = param_type(mu, sigma, a, b);
        in.flags(flags);
        return in;
      }